

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arithmetic.cpp
# Opt level: O2

hugeint_t duckdb::BinaryNumericDivideHugeintWrapper::
          Operation<bool,duckdb::ModuloOperator,duckdb::hugeint_t,duckdb::hugeint_t,duckdb::hugeint_t>
                    (bool fun,hugeint_t left,hugeint_t right,ValidityMask *mask,idx_t idx)

{
  hugeint_t right_00;
  hugeint_t left_00;
  bool bVar1;
  OutOfRangeException *this;
  hugeint_t hVar2;
  hugeint_t right_local;
  hugeint_t left_local;
  string local_88;
  hugeint_t local_68;
  string local_58;
  string local_38;
  
  right_local.upper = right.upper;
  right_local.lower = right.lower;
  left_local.upper = left.upper;
  left_local.lower = left.lower;
  local_88._M_dataplus._M_p = (pointer)0x0;
  local_88._M_string_length = 0x8000000000000000;
  bVar1 = hugeint_t::operator==(&left_local,(hugeint_t *)&local_88);
  if (bVar1) {
    hugeint_t::hugeint_t(&local_68,-1);
    bVar1 = hugeint_t::operator==(&right_local,&local_68);
    if (bVar1) {
      this = (OutOfRangeException *)__cxa_allocate_exception(0x10);
      ::std::__cxx11::string::string
                ((string *)&local_88,"Overflow in division of %s / %s",(allocator *)&local_68);
      hugeint_t::ToString_abi_cxx11_(&local_38,&left_local);
      hugeint_t::ToString_abi_cxx11_(&local_58,&right_local);
      OutOfRangeException::OutOfRangeException<std::__cxx11::string,std::__cxx11::string>
                (this,&local_88,&local_38,&local_58);
      __cxa_throw(this,&OutOfRangeException::typeinfo,::std::runtime_error::~runtime_error);
    }
  }
  hugeint_t::hugeint_t((hugeint_t *)&local_88,0);
  bVar1 = hugeint_t::operator==(&right_local,(hugeint_t *)&local_88);
  if (bVar1) {
    TemplatedValidityMask<unsigned_long>::SetInvalid
              (&mask->super_TemplatedValidityMask<unsigned_long>,idx);
    hVar2.upper = left_local.upper;
    hVar2.lower = left_local.lower;
  }
  else {
    left_00.upper = left_local.upper;
    left_00.lower = left_local.lower;
    right_00.upper = right_local.upper;
    right_00.lower = right_local.lower;
    hVar2 = ModuloOperator::Operation<duckdb::hugeint_t,duckdb::hugeint_t,duckdb::hugeint_t>
                      (left_00,right_00);
  }
  return hVar2;
}

Assistant:

static inline RESULT_TYPE Operation(FUNC fun, LEFT_TYPE left, RIGHT_TYPE right, ValidityMask &mask, idx_t idx) {
		if (left == NumericLimits<LEFT_TYPE>::Minimum() && right == -1) {
			throw OutOfRangeException("Overflow in division of %s / %s", left.ToString(), right.ToString());
		} else if (right == 0) {
			mask.SetInvalid(idx);
			return left;
		} else {
			return OP::template Operation<LEFT_TYPE, RIGHT_TYPE, RESULT_TYPE>(left, right);
		}
	}